

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

int MD5_Update(MD5_CTX *c,void *data,size_t len)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong __n;
  void *pvVar4;
  unsigned_long available;
  unsigned_long used;
  size_t sStack_20;
  MD5_u32plus saved_lo;
  unsigned_long size_local;
  void *data_local;
  MD5_CTX *ctx_local;
  
  uVar1 = c->A;
  uVar2 = uVar1 + (int)len & 0x1fffffff;
  c->A = uVar2;
  if (uVar2 < uVar1) {
    c->B = c->B + 1;
  }
  c->B = c->B + (int)(len >> 0x1d);
  uVar3 = (ulong)(uVar1 & 0x3f);
  sStack_20 = len;
  size_local = (unsigned_long)data;
  if (uVar3 != 0) {
    __n = 0x40 - uVar3;
    if (len < __n) {
      pvVar4 = memcpy((void *)((long)c->data + uVar3),data,len);
      return (int)pvVar4;
    }
    memcpy((void *)((long)c->data + uVar3),data,__n);
    size_local = (long)data + __n;
    sStack_20 = len - __n;
    body((MD5_CTX *)c,c->data,0x40);
  }
  if (0x3f < sStack_20) {
    size_local = (unsigned_long)body((MD5_CTX *)c,(void *)size_local,sStack_20 & 0xffffffffffffffc0)
    ;
    sStack_20 = sStack_20 & 0x3f;
  }
  pvVar4 = memcpy(c->data,(void *)size_local,sStack_20);
  return (int)pvVar4;
}

Assistant:

void MD5_Update(MD5_CTX *ctx, const void *data, unsigned long size)
{
	MD5_u32plus saved_lo;
	unsigned long used, available;

	saved_lo = ctx->lo;
	if ((ctx->lo = (saved_lo + size) & 0x1fffffff) < saved_lo)
		ctx->hi++;
	ctx->hi += size >> 29;

	used = saved_lo & 0x3f;

	if (used) {
		available = 64 - used;

		if (size < available) {
			memcpy(&ctx->buffer[used], data, size);
			return;
		}

		memcpy(&ctx->buffer[used], data, available);
		data = (const unsigned char *)data + available;
		size -= available;
		body(ctx, ctx->buffer, 64);
	}

	if (size >= 64) {
		data = body(ctx, data, size & ~(unsigned long)0x3f);
		size &= 0x3f;
	}

	memcpy(ctx->buffer, data, size);
}